

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *pFxchMan,int iVarNew)

{
  Vec_Int_t *p;
  Vec_Wec_t *pVVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vCube1_00;
  int *piVar6;
  int *piVar7;
  Vec_Int_t *vVec1;
  Vec_Int_t *vLitN;
  Vec_Int_t *vLitP;
  Vec_Int_t *vCube1Copy;
  Vec_Int_t *vCube0Copy;
  Vec_Int_t *vCube1;
  Vec_Int_t *vCube0;
  Vec_Int_t *vCube;
  int *pOutputID1;
  int *pOutputID0;
  int fCompl;
  int RetValue;
  int Lit;
  int j;
  int i;
  int iCube1;
  int iCube0;
  int iVarNew_local;
  Fxch_Man_t *pFxchMan_local;
  
  Lit = 0;
  iCube1 = iVarNew;
  _iCube0 = pFxchMan;
  while( true ) {
    iVar2 = Lit + 1;
    iVar3 = Vec_IntSize(_iCube0->vPairs);
    if (iVar3 <= iVar2) {
      return;
    }
    i = Vec_IntEntry(_iCube0->vPairs,Lit);
    j = Vec_IntEntry(_iCube0->vPairs,Lit + 1);
    pOutputID0._0_4_ = 0;
    vCube0 = Fxch_ManGetCube(_iCube0,i);
    pVVar4 = Fxch_ManGetCube(_iCube0,j);
    pVVar5 = Vec_IntDup(vCube0);
    vCube1_00 = Vec_IntDup(pVVar4);
    iVar2 = Fxch_DivRemoveLits(pVVar5,vCube1_00,_iCube0->vDiv,(int *)&pOutputID0);
    pOutputID0._4_4_ = iVar2;
    iVar3 = Vec_IntSize(_iCube0->vDiv);
    if (iVar2 != iVar3) break;
    iVar2 = Vec_IntSize(_iCube0->vDiv);
    iVar3 = Vec_IntSize(pVVar4);
    _iCube0->nLits = _iCube0->nLits - (iVar2 + iVar3 + -2);
    piVar6 = Vec_IntEntryP(_iCube0->vOutputID,i * _iCube0->nSizeOutputID);
    piVar7 = Vec_IntEntryP(_iCube0->vOutputID,j * _iCube0->nSizeOutputID);
    pOutputID0._4_4_ = 1;
    for (RetValue = 0; RetValue < _iCube0->nSizeOutputID && pOutputID0._4_4_ != 0;
        RetValue = RetValue + 1) {
      pOutputID0._4_4_ = (uint)(piVar6[RetValue] == piVar7[RetValue]);
    }
    if (pOutputID0._4_4_ == 0) {
      for (RetValue = 0; RetValue < _iCube0->nSizeOutputID; RetValue = RetValue + 1) {
        _iCube0->pTempOutputID[RetValue] = piVar6[RetValue] & piVar7[RetValue];
      }
      vVec1 = Vec_WecPushLevel(_iCube0->vCubes);
      Vec_IntAppend(vVec1,pVVar5);
      Vec_IntPushArray(_iCube0->vOutputID,_iCube0->pTempOutputID,_iCube0->nSizeOutputID);
      p = _iCube0->vCubesToUpdate;
      iVar2 = Vec_WecLevelId(_iCube0->vCubes,vVec1);
      Vec_IntPush(p,iVar2);
      for (RetValue = 1; iVar2 = RetValue, iVar3 = Vec_IntSize(vVec1), iVar2 < iVar3;
          RetValue = RetValue + 1) {
        iVar2 = Vec_IntEntry(vVec1,RetValue);
        pVVar1 = _iCube0->vLits;
        fCompl = iVar2;
        iVar3 = Vec_WecLevelId(_iCube0->vCubes,vVec1);
        Vec_WecPush(pVVar1,iVar2,iVar3);
      }
      pOutputID0._4_4_ = 0;
      for (RetValue = 0; RetValue < _iCube0->nSizeOutputID; RetValue = RetValue + 1) {
        _iCube0->pTempOutputID[RetValue] = piVar6[RetValue];
        pOutputID0._4_4_ = piVar6[RetValue] & (piVar7[RetValue] ^ 0xffffffffU) | pOutputID0._4_4_;
        piVar6[RetValue] = (piVar7[RetValue] ^ 0xffffffffU) & piVar6[RetValue];
      }
      if (pOutputID0._4_4_ == 0) {
        Vec_IntClear(vCube0);
      }
      else {
        Vec_IntPush(_iCube0->vCubesToUpdate,i);
      }
      pOutputID0._4_4_ = 0;
      for (RetValue = 0; RetValue < _iCube0->nSizeOutputID; RetValue = RetValue + 1) {
        pOutputID0._4_4_ =
             piVar7[RetValue] & (_iCube0->pTempOutputID[RetValue] ^ 0xffffffffU) | pOutputID0._4_4_;
        piVar7[RetValue] = (_iCube0->pTempOutputID[RetValue] ^ 0xffffffffU) & piVar7[RetValue];
      }
      vCube0 = vVec1;
      if (pOutputID0._4_4_ == 0) {
        Vec_IntClear(pVVar4);
      }
      else {
        Vec_IntPush(_iCube0->vCubesToUpdate,j);
      }
    }
    else {
      Vec_IntClear(vCube0);
      Vec_IntAppend(vCube0,pVVar5);
      Vec_IntPush(_iCube0->vCubesToUpdate,i);
      Vec_IntClear(pVVar4);
      for (RetValue = 0; iVar2 = RetValue, iVar3 = Vec_IntSize(_iCube0->vDiv), iVar2 < iVar3;
          RetValue = RetValue + 1) {
        fCompl = Vec_IntEntry(_iCube0->vDiv,RetValue);
        pVVar1 = _iCube0->vLits;
        iVar2 = Abc_Lit2Var(fCompl);
        pVVar4 = Vec_WecEntry(pVVar1,iVar2);
        iVar2 = Vec_WecLevelId(_iCube0->vCubes,vCube0);
        Vec_IntRemove(pVVar4,iVar2);
        pVVar1 = _iCube0->vLits;
        iVar2 = Abc_Lit2Var(fCompl);
        iVar2 = Abc_LitNot(iVar2);
        pVVar4 = Vec_WecEntry(pVVar1,iVar2);
        iVar2 = Vec_WecLevelId(_iCube0->vCubes,vCube0);
        Vec_IntRemove(pVVar4,iVar2);
      }
    }
    Vec_IntFree(pVVar5);
    Vec_IntFree(vCube1_00);
    if (iCube1 != 0) {
      pVVar1 = _iCube0->vLits;
      iVar2 = Vec_WecSize(_iCube0->vLits);
      pVVar4 = Vec_WecEntry(pVVar1,iVar2 + -2);
      pVVar1 = _iCube0->vLits;
      iVar2 = Vec_WecSize(_iCube0->vLits);
      pVVar5 = Vec_WecEntry(pVVar1,iVar2 + -1);
      if (vCube0 == (Vec_Int_t *)0x0) {
        __assert_fail("vCube",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                      ,0x1ed,"void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *, const int)");
      }
      iVar2 = Vec_IntSize(_iCube0->vDiv);
      if ((iVar2 == 2) || ((int)pOutputID0 != 0)) {
        iVar2 = Abc_Var2Lit(iCube1,1);
        Vec_IntPush(vCube0,iVar2);
        iVar2 = Vec_WecLevelId(_iCube0->vCubes,vCube0);
        Vec_IntPush(pVVar5,iVar2);
        Vec_IntSort(pVVar5,0);
      }
      else {
        iVar2 = Abc_Var2Lit(iCube1,0);
        Vec_IntPush(vCube0,iVar2);
        iVar2 = Vec_WecLevelId(_iCube0->vCubes,vCube0);
        Vec_IntPush(pVVar4,iVar2);
        Vec_IntSort(pVVar4,0);
      }
    }
    Lit = Lit + 2;
  }
  __assert_fail("RetValue == Vec_IntSize( pFxchMan->vDiv )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                ,0x19a,"void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *, const int)");
}

Assistant:

static inline void Fxch_ManExtractDivFromCubePairs( Fxch_Man_t* pFxchMan,
                                                   const int iVarNew )
{
    /* For each pair (Ci, Cj) */
    int iCube0, iCube1, i;


    Vec_IntForEachEntryDouble( pFxchMan->vPairs, iCube0, iCube1, i )
    {
        int j, Lit,
            RetValue,
            fCompl = 0;
        int * pOutputID0, * pOutputID1;

        Vec_Int_t* vCube = NULL,
                 * vCube0 = Fxch_ManGetCube( pFxchMan, iCube0 ),
                 * vCube1 = Fxch_ManGetCube( pFxchMan, iCube1 ),
                 * vCube0Copy = Vec_IntDup( vCube0 ),
                 * vCube1Copy = Vec_IntDup( vCube1 );

        RetValue  = Fxch_DivRemoveLits( vCube0Copy, vCube1Copy, pFxchMan->vDiv, &fCompl );

        assert( RetValue == Vec_IntSize( pFxchMan->vDiv ) );

        pFxchMan->nLits -= Vec_IntSize( pFxchMan->vDiv ) + Vec_IntSize( vCube1 ) - 2;

        /* Identify type of Extraction */
        pOutputID0 = Vec_IntEntryP( pFxchMan->vOutputID, iCube0 * pFxchMan->nSizeOutputID );
        pOutputID1 = Vec_IntEntryP( pFxchMan->vOutputID, iCube1 * pFxchMan->nSizeOutputID );
        RetValue = 1;
        for ( j = 0; j < pFxchMan->nSizeOutputID && RetValue; j++ )
            RetValue = ( pOutputID0[j] == pOutputID1[j] );

        /* Exact Extractraion */
        if ( RetValue )
        {
            Vec_IntClear( vCube0 );
            Vec_IntAppend( vCube0, vCube0Copy );
            vCube = vCube0;

            Vec_IntPush( pFxchMan->vCubesToUpdate, iCube0 );
            Vec_IntClear( vCube1 );

            /* Update Lit -> Cube mapping */
            Vec_IntForEachEntry( pFxchMan->vDiv, Lit, j )
            {
                Vec_IntRemove( Vec_WecEntry( pFxchMan->vLits, Abc_Lit2Var( Lit ) ),
                               Vec_WecLevelId( pFxchMan->vCubes, vCube0 ) );
                Vec_IntRemove( Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Abc_Lit2Var( Lit ) ) ),
                               Vec_WecLevelId( pFxchMan->vCubes, vCube0 ) );
            }

        }
        /* Unexact Extraction */
        else
        {
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                pFxchMan->pTempOutputID[j] = ( pOutputID0[j] & pOutputID1[j] );

            /* Create new cube */
            vCube = Vec_WecPushLevel( pFxchMan->vCubes );
            Vec_IntAppend( vCube, vCube0Copy );
            Vec_IntPushArray( pFxchMan->vOutputID, pFxchMan->pTempOutputID, pFxchMan->nSizeOutputID );
            Vec_IntPush( pFxchMan->vCubesToUpdate, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );

            /* Update Lit -> Cube mapping */
            Vec_IntForEachEntryStart( vCube, Lit, j, 1 )
                Vec_WecPush( pFxchMan->vLits, Lit, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );

            /*********************************************************/
            RetValue = 0;
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            {
                pFxchMan->pTempOutputID[j] = pOutputID0[j];
                RetValue |= ( pOutputID0[j] & ~( pOutputID1[j] ) );
                pOutputID0[j] &= ~( pOutputID1[j] );
            }

            if ( RetValue != 0 )
                Vec_IntPush( pFxchMan->vCubesToUpdate, iCube0 );
            else
                Vec_IntClear( vCube0 );

            /*********************************************************/
            RetValue = 0;
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            {
                RetValue |= ( pOutputID1[j] & ~( pFxchMan->pTempOutputID[j] ) );
                pOutputID1[j] &= ~( pFxchMan->pTempOutputID[j] );
            }

            if ( RetValue != 0 )
                Vec_IntPush( pFxchMan->vCubesToUpdate, iCube1 );
            else
                Vec_IntClear( vCube1 );

        }
        Vec_IntFree( vCube0Copy );
        Vec_IntFree( vCube1Copy );

        if ( iVarNew )
        {
            Vec_Int_t* vLitP = Vec_WecEntry( pFxchMan->vLits, Vec_WecSize( pFxchMan->vLits ) - 2 ),
                     * vLitN = Vec_WecEntry( pFxchMan->vLits, Vec_WecSize( pFxchMan->vLits ) - 1 );

            assert( vCube );
            if ( Vec_IntSize( pFxchMan->vDiv ) == 2 || fCompl )
            {
                Vec_IntPush( vCube, Abc_Var2Lit( iVarNew, 1 ) );
                Vec_IntPush( vLitN, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );
                Vec_IntSort( vLitN, 0 );
            }
            else
            {
                Vec_IntPush( vCube, Abc_Var2Lit( iVarNew, 0 ) );
                Vec_IntPush( vLitP, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );
                Vec_IntSort( vLitP, 0 );
            }
        }
    }

    return;
}